

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

int Fantasy_Character_json_union_accept_type(uint8_t type)

{
  undefined4 local_c;
  uint8_t type_local;
  
  if (type == '\0') {
    local_c = 1;
  }
  else if (type == '\x02') {
    local_c = 1;
  }
  else if (type == '\b') {
    local_c = 1;
  }
  else if (type == '\t') {
    local_c = 1;
  }
  else if (type == '\n') {
    local_c = 1;
  }
  else if (type == '\v') {
    local_c = 1;
  }
  else if (type == 0xff) {
    local_c = 1;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

static int Fantasy_Character_json_union_accept_type(uint8_t type)
{
    switch (type) {
    case 0: return 1; /* NONE */
    case 2: return 1; /* MuLan */
    case 8: return 1; /* Rapunzel */
    case 9: return 1; /* Belle */
    case 10: return 1; /* BookFan */
    case 11: return 1; /* Other */
    case 255: return 1; /* Unused */
    default: return 0;
    }
}